

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int glfwUpdateGamepadMappings(char *string)

{
  byte bVar1;
  GLFWbool GVar2;
  byte *__s;
  _GLFWmapping *p_Var3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  _GLFWjoystick *js;
  bool bVar7;
  _GLFWmapping mapping;
  char line [1024];
  
  if (string != (char *)0x0) {
    if (_glfw.initialized == 0) {
      iVar6 = 0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      for (; bVar1 = *string, bVar1 != 0; string = (char *)((byte *)string + (long)__s)) {
        if (((byte)(bVar1 - 0x30) < 10) ||
           ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0))))
        {
          __s = (byte *)strcspn(string,"\r\n");
          if (__s < (byte *)0x400) {
            memset(&mapping,0,0xf5);
            memcpy(line,string,(size_t)__s);
            line[(long)__s] = '\0';
            GVar2 = parseMapping(&mapping,line);
            if (GVar2 != 0) {
              p_Var3 = findMapping(mapping.guid);
              if (p_Var3 == (_GLFWmapping *)0x0) {
                lVar4 = (long)_glfw.mappingCount;
                _glfw.mappingCount = (int)(lVar4 + 1);
                _glfw.mappings = (_GLFWmapping *)_glfw_realloc(_glfw.mappings,(lVar4 + 1) * 0xf5);
                p_Var3 = _glfw.mappings + (long)_glfw.mappingCount + -1;
              }
              memcpy(p_Var3,&mapping,0xf5);
            }
          }
        }
        else {
          sVar5 = strcspn(string,"\r\n");
          __s = (byte *)string + sVar5;
          string = (char *)strspn((char *)__s,"\r\n");
        }
      }
      js = _glfw.joysticks;
      lVar4 = 0x10;
      iVar6 = 1;
      while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
        if (js->connected != 0) {
          p_Var3 = findValidMapping(js);
          js->mapping = p_Var3;
        }
        js = js + 1;
      }
    }
    return iVar6;
  }
  __assert_fail("string != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/cal-cs184[P]hw0-intro/CGL/deps/glfw/src/input.c"
                ,0x4ed,"int glfwUpdateGamepadMappings(const char *)");
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if ((*c >= '0' && *c <= '9') ||
            (*c >= 'a' && *c <= 'f') ||
            (*c >= 'A' && *c <= 'F'))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            _glfw_realloc(_glfw.mappings,
                                          sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->connected)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}